

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O0

void aom_highbd_quantize_b_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long in_RSI;
  undefined1 (*in_RDI) [32];
  undefined8 *in_stack_00000008;
  __m256i eob;
  uint step;
  __m256i eob_s;
  __m256i dq_1;
  __m256i q_1;
  __m256i nz_mask_1;
  __m256i abs_dq_1;
  __m256i abs_q_1;
  __m256i tmp2_1;
  __m256i tmp_1;
  __m256i tmp_rnd_1;
  __m256i zero_1;
  __m256i zbin_mask_1;
  __m256i abs_coeff_1;
  __m256i coeff_1;
  __m256i dq;
  __m256i q;
  __m256i nz_mask;
  __m256i abs_dq;
  __m256i abs_q;
  __m256i tmp2;
  __m256i tmp;
  __m256i tmp_rnd;
  __m256i zero;
  __m256i zbin_mask;
  __m256i abs_coeff;
  __m256i coeff;
  __m256i nz_iscan;
  __m256i iscan_plus1;
  __m256i iscan_1;
  __m256i packed_nz_mask_perm;
  __m256i packed_nz_mask;
  __m256i nz_iscan_1;
  __m256i iscan_plus1_1;
  __m256i iscan_2;
  __m256i packed_nz_mask_perm_1;
  __m256i packed_nz_mask_1;
  __m256i mask_1;
  __m256i mult_hi_1;
  __m256i prod_hi_1;
  __m256i prod_lo_1;
  __m256i mask;
  __m256i mult_hi;
  __m256i prod_hi;
  __m256i prod_lo;
  __m256i mask_3;
  __m256i mult_hi_3;
  __m256i prod_hi_3;
  __m256i prod_lo_3;
  __m256i mask_2;
  __m256i mult_hi_2;
  __m256i prod_hi_2;
  __m256i prod_lo_2;
  int in_stack_ffffffffffffe1e8;
  longlong local_1e00;
  longlong lStack_1df8;
  longlong lStack_1df0;
  longlong lStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  __m256i *in_stack_ffffffffffffe278;
  int16_t *in_stack_ffffffffffffe280;
  int16_t *in_stack_ffffffffffffe288;
  int16_t *in_stack_ffffffffffffe290;
  int16_t *in_stack_ffffffffffffe298;
  undefined1 auVar21 [32];
  long local_1d10;
  undefined1 (*local_1d08) [32];
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  long lStack_1b68;
  ulong uStack_1ad8;
  undefined8 uStack_1ab8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined4 local_1914;
  undefined1 *local_1910;
  tran_low_t *local_1908;
  undefined8 *local_1900;
  int16_t *local_18f8;
  longlong *local_18e8;
  undefined1 local_18e0 [32];
  undefined1 local_18c0 [32];
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1740;
  ulong uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  long lStack_1628;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  tran_low_t *local_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 *local_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  tran_low_t *local_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 *local_1508;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  long lStack_13e8;
  undefined1 local_13e0 [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  int16_t *local_1120;
  int16_t *local_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined4 local_cb4;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  undefined1 local_ca0 [16];
  undefined1 auStack_c90 [16];
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined4 local_c70;
  undefined4 local_c6c;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined4 local_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined4 local_b04;
  undefined4 local_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined4 local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined4 local_994;
  undefined8 *local_990;
  undefined1 *local_988;
  undefined1 local_980 [16];
  undefined1 auStack_970 [16];
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined4 local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined4 local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined4 local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined4 local_7e4;
  undefined4 local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined4 local_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined4 local_a4;
  undefined1 local_a0 [32];
  
  auVar21 = ZEXT1632(ZEXT816(0));
  init_qp((int16_t *)0x0,in_stack_ffffffffffffe298,in_stack_ffffffffffffe290,
          in_stack_ffffffffffffe288,in_stack_ffffffffffffe280,in_stack_ffffffffffffe278,
          in_stack_ffffffffffffe1e8);
  local_18f8 = scan;
  local_1900 = in_stack_00000008;
  local_1908 = qcoeff_ptr;
  local_1910 = &stack0xffffffffffffe2a0;
  local_1914 = 1;
  local_1940 = *(undefined8 *)*in_RDI;
  uStack_1938 = *(undefined8 *)(*in_RDI + 8);
  uStack_1930 = *(undefined8 *)(*in_RDI + 0x10);
  uStack_1928 = *(undefined8 *)(*in_RDI + 0x18);
  local_1960 = vpabsd_avx2(*in_RDI);
  auVar3._8_8_ = lStack_1df8;
  auVar3._0_8_ = local_1e00;
  auVar3._16_8_ = lStack_1df0;
  auVar3._24_8_ = lStack_1de8;
  local_16e0 = local_1960._0_8_;
  uStack_16d8 = local_1960._8_8_;
  uStack_16d0 = local_1960._16_8_;
  uStack_16c8 = local_1960._24_8_;
  local_1980 = vpcmpgtd_avx2(local_1960,auVar3);
  local_1640 = local_1980._0_8_;
  uStack_1638 = local_1980._8_8_;
  uStack_1630 = local_1980._16_8_;
  lStack_1628 = local_1980._24_8_;
  if ((((((((((((((((((((((((((((((((local_1980 >> 7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_1980 >> 0xf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_1980 >> 0x17 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_1980 >> 0x1f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_1980 >> 0x27 & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0) &&
                               (local_1980 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (local_1980 >> 0x37 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (local_1980 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (local_1980 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                            ) && (local_1980 >> 0x4f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                          (local_1980 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_1980 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1980 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_1980 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1980 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1980 >> 0x7f,0) == '\0') &&
                    (local_1980 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_1980 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1980 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_1980 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_1980 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (local_1980 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_1980 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_1980 >> 0xbf,0) == '\0') &&
            (local_1980 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_1980 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_1980 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_1980 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_1980 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (local_1980 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (local_1980 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      -1 < (long)local_1980._24_8_) {
    local_18c0._8_8_ = SUB328(ZEXT832(0),4);
    local_19a0 = 0;
    uStack_1998 = local_18c0._8_8_;
    uStack_1990 = 0;
    uStack_1988 = 0;
    local_1588 = in_stack_00000008;
    local_15c0 = 0;
    uStack_15b8 = local_18c0._8_8_;
    uStack_15b0 = 0;
    uStack_15a8 = 0;
    *in_stack_00000008 = 0;
    in_stack_00000008[1] = local_18c0._8_8_;
    in_stack_00000008[2] = 0;
    in_stack_00000008[3] = 0;
    local_15c8 = qcoeff_ptr;
    local_1600 = 0;
    uStack_15f8 = local_18c0._8_8_;
    uStack_15f0 = 0;
    uStack_15e8 = 0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    *(undefined8 *)(qcoeff_ptr + 2) = local_18c0._8_8_;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    local_18c0 = ZEXT832(0) << 0x20;
  }
  else {
    auVar5._8_8_ = uStack_1dd8;
    auVar5._0_8_ = local_1de0;
    auVar5._16_8_ = uStack_1dd0;
    auVar5._24_8_ = uStack_1dc8;
    local_1840 = local_1960._0_8_;
    uStack_1838 = local_1960._8_8_;
    uStack_1830 = local_1960._16_8_;
    uStack_1828 = local_1960._24_8_;
    local_13e0 = vpaddd_avx2(local_1960,auVar5);
    local_1400 = local_1980._0_8_;
    uStack_13f8 = local_1980._8_8_;
    uStack_13f0 = local_1980._16_8_;
    lStack_13e8 = local_1980._24_8_;
    local_19c0 = vpand_avx2(local_13e0,local_1980);
    local_990 = &local_1dc0;
    local_988 = local_19c0;
    local_994 = 0;
    local_8a0 = local_19c0._0_8_;
    uStack_898 = local_19c0._8_8_;
    uStack_890 = local_19c0._16_8_;
    uStack_888 = local_19c0._24_8_;
    auVar11._8_8_ = uStack_1db8;
    auVar11._0_8_ = local_1dc0;
    auVar11._16_8_ = uStack_1db0;
    auVar11._24_8_ = uStack_1da8;
    auVar3 = vpmuldq_avx2(local_19c0,auVar11);
    local_7a0 = local_19c0._0_8_;
    uStack_798 = local_19c0._8_8_;
    uStack_790 = local_19c0._16_8_;
    uStack_788 = local_19c0._24_8_;
    local_7a4 = 0x20;
    auVar5 = vpsrlq_avx2(local_19c0,ZEXT416(0x20));
    auVar12._8_8_ = uStack_1db8;
    auVar12._0_8_ = local_1dc0;
    auVar12._16_8_ = uStack_1db0;
    auVar12._24_8_ = uStack_1da8;
    local_7e4 = 0x20;
    local_a00 = vpsrlq_avx2(auVar12,ZEXT416(0x20));
    local_9e0._0_8_ = auVar5._0_8_;
    local_9e0._8_8_ = auVar5._8_8_;
    local_9e0._16_8_ = auVar5._16_8_;
    local_9e0._24_8_ = auVar5._24_8_;
    local_8e0 = local_9e0._0_8_;
    uStack_8d8 = local_9e0._8_8_;
    uStack_8d0 = local_9e0._16_8_;
    uStack_8c8 = local_9e0._24_8_;
    local_900 = local_a00._0_8_;
    uStack_8f8 = local_a00._8_8_;
    uStack_8f0 = local_a00._16_8_;
    uStack_8e8 = local_a00._24_8_;
    auVar5 = vpmuldq_avx2(auVar5,local_a00);
    local_9c0._0_8_ = auVar3._0_8_;
    local_9c0._8_8_ = auVar3._8_8_;
    local_9c0._16_8_ = auVar3._16_8_;
    local_9c0._24_8_ = auVar3._24_8_;
    local_824 = 0x10;
    local_820 = local_9c0._0_8_;
    uStack_818 = local_9c0._8_8_;
    uStack_810 = local_9c0._16_8_;
    uStack_808 = local_9c0._24_8_;
    auVar3 = vpsrlq_avx2(auVar3,ZEXT416(0x10));
    local_944 = 0;
    local_948 = 0xffffffff;
    local_94c = 0;
    local_950 = 0xffffffff;
    local_954 = 0;
    local_958 = 0xffffffff;
    local_95c = 0;
    local_960 = 0xffffffff;
    auVar1 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
    auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
    local_980 = vpinsrd_avx(auVar1,0,3);
    auVar1 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
    auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
    auStack_970 = vpinsrd_avx(auVar1,0,3);
    local_a20 = local_980._0_8_;
    uStack_a18 = local_980._8_8_;
    uStack_a10 = auStack_970._0_8_;
    uStack_a08 = auStack_970._8_8_;
    local_9c0._0_8_ = auVar3._0_8_;
    local_9c0._8_8_ = auVar3._8_8_;
    local_9c0._16_8_ = auVar3._16_8_;
    local_9c0._24_8_ = auVar3._24_8_;
    local_920 = local_9c0._0_8_;
    uStack_918 = local_9c0._8_8_;
    uStack_910 = local_9c0._16_8_;
    uStack_908 = local_9c0._24_8_;
    local_940 = local_980._0_8_;
    uStack_938 = local_980._8_8_;
    uStack_930 = auStack_970._0_8_;
    uStack_928 = auStack_970._8_8_;
    auVar6._16_8_ = auStack_970._0_8_;
    auVar6._0_16_ = local_980;
    auVar6._24_8_ = auStack_970._8_8_;
    local_9c0 = vpand_avx2(auVar3,auVar6);
    local_9e0._0_8_ = auVar5._0_8_;
    local_9e0._8_8_ = auVar5._8_8_;
    local_9e0._16_8_ = auVar5._16_8_;
    local_9e0._24_8_ = auVar5._24_8_;
    local_864 = 0x10;
    local_860 = local_9e0._0_8_;
    uStack_858 = local_9e0._8_8_;
    uStack_850 = local_9e0._16_8_;
    uStack_848 = local_9e0._24_8_;
    auVar3 = vpsrlq_avx2(auVar5,ZEXT416(0x10));
    local_9e0._0_8_ = auVar3._0_8_;
    local_9e0._8_8_ = auVar3._8_8_;
    local_9e0._16_8_ = auVar3._16_8_;
    local_9e0._24_8_ = auVar3._24_8_;
    local_760 = local_9e0._0_8_;
    uStack_758 = local_9e0._8_8_;
    uStack_750 = local_9e0._16_8_;
    uStack_748 = local_9e0._24_8_;
    local_764 = 0x20;
    local_9e0 = vpsllq_avx2(auVar3,ZEXT416(0x20));
    local_720 = local_9c0._0_8_;
    uStack_718 = local_9c0._8_8_;
    uStack_710 = local_9c0._16_8_;
    uStack_708 = local_9c0._24_8_;
    local_740 = local_9e0._0_8_;
    uStack_738 = local_9e0._8_8_;
    uStack_730 = local_9e0._16_8_;
    uStack_728 = local_9e0._24_8_;
    local_19e0 = vpor_avx2(local_9c0,local_9e0);
    local_1880 = local_19e0._0_8_;
    uStack_1878 = local_19e0._8_8_;
    uStack_1870 = local_19e0._16_8_;
    uStack_1868 = local_19e0._24_8_;
    local_18a0 = local_19c0._0_8_;
    uStack_1898 = local_19c0._8_8_;
    uStack_1890 = local_19c0._16_8_;
    uStack_1888 = local_19c0._24_8_;
    local_1a00 = vpaddd_avx2(local_19e0,local_19c0);
    local_cb0 = &stack0xffffffffffffe280;
    local_ca8 = local_1a00;
    local_cb4 = 1;
    local_bc0 = local_1a00._0_8_;
    uStack_bb8 = local_1a00._8_8_;
    uStack_bb0 = local_1a00._16_8_;
    uStack_ba8 = local_1a00._24_8_;
    auVar17._8_8_ = in_stack_ffffffffffffe288;
    auVar17._0_8_ = in_stack_ffffffffffffe280;
    auVar17._16_8_ = in_stack_ffffffffffffe290;
    auVar17._24_8_ = in_stack_ffffffffffffe298;
    auVar3 = vpmuldq_avx2(local_1a00,auVar17);
    local_ac0 = local_1a00._0_8_;
    uStack_ab8 = local_1a00._8_8_;
    uStack_ab0 = local_1a00._16_8_;
    uStack_aa8 = local_1a00._24_8_;
    local_ac4 = 0x20;
    auVar5 = vpsrlq_avx2(local_1a00,ZEXT416(0x20));
    auVar18._8_8_ = in_stack_ffffffffffffe288;
    auVar18._0_8_ = in_stack_ffffffffffffe280;
    auVar18._16_8_ = in_stack_ffffffffffffe290;
    auVar18._24_8_ = in_stack_ffffffffffffe298;
    local_b04 = 0x20;
    local_d20 = vpsrlq_avx2(auVar18,ZEXT416(0x20));
    local_d00._0_8_ = auVar5._0_8_;
    local_d00._8_8_ = auVar5._8_8_;
    local_d00._16_8_ = auVar5._16_8_;
    local_d00._24_8_ = auVar5._24_8_;
    local_c00 = local_d00._0_8_;
    uStack_bf8 = local_d00._8_8_;
    uStack_bf0 = local_d00._16_8_;
    uStack_be8 = local_d00._24_8_;
    local_c20 = local_d20._0_8_;
    uStack_c18 = local_d20._8_8_;
    uStack_c10 = local_d20._16_8_;
    uStack_c08 = local_d20._24_8_;
    auVar5 = vpmuldq_avx2(auVar5,local_d20);
    local_ce0._0_8_ = auVar3._0_8_;
    local_ce0._8_8_ = auVar3._8_8_;
    local_ce0._16_8_ = auVar3._16_8_;
    local_ce0._24_8_ = auVar3._24_8_;
    local_b44 = 0xf;
    local_b40 = local_ce0._0_8_;
    uStack_b38 = local_ce0._8_8_;
    uStack_b30 = local_ce0._16_8_;
    uStack_b28 = local_ce0._24_8_;
    auVar3 = vpsrlq_avx2(auVar3,ZEXT416(0xf));
    local_c64 = 0;
    local_c68 = 0xffffffff;
    local_c6c = 0;
    local_c70 = 0xffffffff;
    local_c74 = 0;
    local_c78 = 0xffffffff;
    local_c7c = 0;
    local_c80 = 0xffffffff;
    auVar1 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
    auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
    local_ca0 = vpinsrd_avx(auVar1,0,3);
    auVar1 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
    auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
    auStack_c90 = vpinsrd_avx(auVar1,0,3);
    local_d40 = local_ca0._0_8_;
    uStack_d38 = local_ca0._8_8_;
    uStack_d30 = auStack_c90._0_8_;
    uStack_d28 = auStack_c90._8_8_;
    local_ce0._0_8_ = auVar3._0_8_;
    local_ce0._8_8_ = auVar3._8_8_;
    local_ce0._16_8_ = auVar3._16_8_;
    local_ce0._24_8_ = auVar3._24_8_;
    local_c40 = local_ce0._0_8_;
    uStack_c38 = local_ce0._8_8_;
    uStack_c30 = local_ce0._16_8_;
    uStack_c28 = local_ce0._24_8_;
    local_c60 = local_ca0._0_8_;
    uStack_c58 = local_ca0._8_8_;
    uStack_c50 = auStack_c90._0_8_;
    uStack_c48 = auStack_c90._8_8_;
    auVar4._16_8_ = auStack_c90._0_8_;
    auVar4._0_16_ = local_ca0;
    auVar4._24_8_ = auStack_c90._8_8_;
    local_ce0 = vpand_avx2(auVar3,auVar4);
    local_d00._0_8_ = auVar5._0_8_;
    local_d00._8_8_ = auVar5._8_8_;
    local_d00._16_8_ = auVar5._16_8_;
    local_d00._24_8_ = auVar5._24_8_;
    local_b84 = 0xf;
    local_b80 = local_d00._0_8_;
    uStack_b78 = local_d00._8_8_;
    uStack_b70 = local_d00._16_8_;
    uStack_b68 = local_d00._24_8_;
    auVar3 = vpsrlq_avx2(auVar5,ZEXT416(0xf));
    local_d00._0_8_ = auVar3._0_8_;
    local_d00._8_8_ = auVar3._8_8_;
    local_d00._16_8_ = auVar3._16_8_;
    local_d00._24_8_ = auVar3._24_8_;
    local_a80 = local_d00._0_8_;
    uStack_a78 = local_d00._8_8_;
    uStack_a70 = local_d00._16_8_;
    uStack_a68 = local_d00._24_8_;
    local_a84 = 0x20;
    local_d00 = vpsllq_avx2(auVar3,ZEXT416(0x20));
    local_a40 = local_ce0._0_8_;
    uStack_a38 = local_ce0._8_8_;
    uStack_a30 = local_ce0._16_8_;
    uStack_a28 = local_ce0._24_8_;
    local_a60 = local_d00._0_8_;
    uStack_a58 = local_d00._8_8_;
    uStack_a50 = local_d00._16_8_;
    uStack_a48 = local_d00._24_8_;
    auVar5 = vpor_avx2(local_ce0,local_d00);
    local_1a20 = auVar5._0_8_;
    uStack_1a18 = auVar5._8_8_;
    uStack_1a10 = auVar5._16_8_;
    uStack_1a08 = auVar5._24_8_;
    auVar15._8_8_ = uStack_1d98;
    auVar15._0_8_ = local_1da0;
    auVar15._16_8_ = uStack_1d90;
    auVar15._24_8_ = in_stack_ffffffffffffe278;
    local_1360 = local_1a20;
    uStack_1358 = uStack_1a18;
    uStack_1350 = uStack_1a10;
    uStack_1348 = uStack_1a08;
    local_a0 = vpmulld_avx2(auVar5,auVar15);
    local_a4 = 1;
    auVar4 = vpsrld_avx2(local_a0,ZEXT416(1));
    local_18e0._8_8_ = SUB328(ZEXT832(0),4);
    local_1720 = local_1a20;
    uStack_1718 = uStack_1a18;
    uStack_1710 = uStack_1a10;
    uStack_1708 = uStack_1a08;
    local_1740 = 0;
    uStack_1738 = local_18e0._8_8_;
    uStack_1730 = 0;
    uStack_1728 = 0;
    auVar3 = vpcmpgtd_avx2(auVar5,ZEXT832((ulong)local_18e0._8_8_) << 0x40);
    local_12a0 = local_1a20;
    uStack_1298 = uStack_1a18;
    uStack_1290 = uStack_1a10;
    uStack_1288 = uStack_1a08;
    auVar5 = vpsignd_avx2(auVar5,*in_RDI);
    local_1a40 = auVar4._0_8_;
    uStack_1a38 = auVar4._8_8_;
    uStack_1a30 = auVar4._16_8_;
    uStack_1a28 = auVar4._24_8_;
    local_12e0 = local_1a40;
    uStack_12d8 = uStack_1a38;
    uStack_12d0 = uStack_1a30;
    uStack_12c8 = uStack_1a28;
    auVar4 = vpsignd_avx2(auVar4,*in_RDI);
    local_1a80 = auVar5._0_8_;
    uStack_1a78 = auVar5._8_8_;
    uStack_1a70 = auVar5._16_8_;
    uStack_1a68 = auVar5._24_8_;
    local_1508 = in_stack_00000008;
    local_1540 = local_1a80;
    uStack_1538 = uStack_1a78;
    uStack_1530 = uStack_1a70;
    uStack_1528 = uStack_1a68;
    *in_stack_00000008 = local_1a80;
    in_stack_00000008[1] = uStack_1a78;
    in_stack_00000008[2] = uStack_1a70;
    in_stack_00000008[3] = uStack_1a68;
    local_1aa0 = auVar4._0_8_;
    uStack_1a98 = auVar4._8_8_;
    uStack_1a90 = auVar4._16_8_;
    uStack_1a88 = auVar4._24_8_;
    local_1548 = qcoeff_ptr;
    local_1580 = local_1aa0;
    uStack_1578 = uStack_1a98;
    uStack_1570 = uStack_1a90;
    uStack_1568 = uStack_1a88;
    *(undefined8 *)qcoeff_ptr = local_1aa0;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_1a98;
    *(undefined8 *)(qcoeff_ptr + 4) = uStack_1a90;
    *(undefined8 *)(qcoeff_ptr + 6) = uStack_1a88;
    local_1140 = 0;
    uStack_1138 = 0;
    uStack_1130 = 0;
    uStack_1128 = 0;
    local_1a60 = auVar3._0_8_;
    uStack_1a58 = auVar3._8_8_;
    uStack_1a50 = auVar3._16_8_;
    uStack_1a48 = auVar3._24_8_;
    local_1120 = scan;
    local_1160 = local_1a60;
    uStack_1158 = uStack_1a58;
    uStack_1150 = uStack_1a50;
    uStack_1148 = uStack_1a48;
    local_f20 = local_1a60;
    uStack_f18 = uStack_1a58;
    uStack_f10 = uStack_1a50;
    uStack_f08 = uStack_1a48;
    local_f40 = local_1a60;
    uStack_f38 = uStack_1a58;
    uStack_f30 = uStack_1a50;
    uStack_f28 = uStack_1a48;
    local_1180 = vpackssdw_avx2(auVar3,auVar3);
    local_11a0 = vpermq_avx2(local_1180,0xd8);
    local_1118 = scan;
    local_11c0 = *(undefined8 *)scan;
    uStack_11b8 = *(undefined8 *)(scan + 4);
    uStack_11b0 = 0;
    uStack_11a8 = 0;
    uStack_e90 = 0;
    uStack_e88 = 0;
    local_ec0 = local_11a0._0_8_;
    uStack_eb8 = local_11a0._8_8_;
    uStack_eb0 = local_11a0._16_8_;
    uStack_ea8 = local_11a0._24_8_;
    local_11e0 = vpsubw_avx2(ZEXT1632(*(undefined1 (*) [16])scan),local_11a0);
    local_10e0 = local_11e0._0_8_;
    uStack_10d8 = local_11e0._8_8_;
    uStack_10d0 = local_11e0._16_8_;
    uStack_10c8 = local_11e0._24_8_;
    local_1100 = local_11a0._0_8_;
    uStack_10f8 = local_11a0._8_8_;
    uStack_10f0 = local_11a0._16_8_;
    uStack_10e8 = local_11a0._24_8_;
    local_1200 = vpand_avx2(local_11e0,local_11a0);
    local_e40 = local_1200._0_8_;
    uStack_e38 = local_1200._8_8_;
    uStack_e30 = local_1200._16_8_;
    uStack_e28 = local_1200._24_8_;
    auVar21 = vpmaxsw_avx2(auVar21,local_1200);
    local_18e0 = ZEXT832(0) << 0x20;
    local_1300 = local_1940;
    uStack_12f8 = uStack_1938;
    uStack_12f0 = uStack_1930;
    uStack_12e8 = uStack_1928;
    local_12c0 = local_1940;
    uStack_12b8 = uStack_1938;
    uStack_12b0 = uStack_1930;
    uStack_12a8 = uStack_1928;
    local_1110 = local_11c0;
    uStack_1108 = uStack_11b8;
    local_ea0 = local_11c0;
    uStack_e98 = uStack_11b8;
    local_e20 = local_1140;
    uStack_e18 = uStack_1138;
    uStack_e10 = uStack_1130;
    uStack_e08 = uStack_1128;
  }
  local_1d08 = in_RDI + 1;
  in_stack_00000008 = in_stack_00000008 + 4;
  qcoeff_ptr = qcoeff_ptr + 8;
  scan = scan + 8;
  local_18e8 = &local_1e00;
  local_1780 = local_1940;
  uStack_1778 = uStack_1938;
  uStack_1770 = uStack_1930;
  uStack_1768 = uStack_1928;
  update_qp((__m256i *)&local_1e00);
  for (local_1d10 = in_RSI + -8; 0 < local_1d10; local_1d10 = local_1d10 + -8) {
    auVar3 = vpabsd_avx2(*local_1d08);
    auVar9._8_8_ = lStack_1df8;
    auVar9._0_8_ = local_1e00;
    auVar9._16_8_ = lStack_1df0;
    auVar9._24_8_ = lStack_1de8;
    auVar5 = vpcmpgtd_avx2(auVar3,auVar9);
    lStack_1b68 = auVar5._24_8_;
    if ((((((((((((((((((((((((((((((((auVar5 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                     && (auVar5 >> 0xf & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                    (auVar5 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar5 >> 0x27 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar5 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar5 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar5 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar5 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar5 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar5 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar5 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar5 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar5 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar5 >> 0x7f,0) == '\0') &&
                      (auVar5 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar5 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar5 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar5 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar5 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar5 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar5 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar5 >> 0xbf,0) == '\0') &&
              (auVar5 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar5 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar5 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar5 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar5 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar5 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar5 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < lStack_1b68) {
      uStack_1ab8 = SUB328(ZEXT832(0),4);
      *in_stack_00000008 = 0;
      in_stack_00000008[1] = uStack_1ab8;
      in_stack_00000008[2] = 0;
      in_stack_00000008[3] = 0;
      qcoeff_ptr[0] = 0;
      qcoeff_ptr[1] = 0;
      *(undefined8 *)(qcoeff_ptr + 2) = uStack_1ab8;
      qcoeff_ptr[4] = 0;
      qcoeff_ptr[5] = 0;
      qcoeff_ptr[6] = 0;
      qcoeff_ptr[7] = 0;
    }
    else {
      auVar10._8_8_ = uStack_1dd8;
      auVar10._0_8_ = local_1de0;
      auVar10._16_8_ = uStack_1dd0;
      auVar10._24_8_ = uStack_1dc8;
      auVar3 = vpaddd_avx2(auVar3,auVar10);
      auVar3 = vpand_avx2(auVar3,auVar5);
      auVar13._8_8_ = uStack_1db8;
      auVar13._0_8_ = local_1dc0;
      auVar13._16_8_ = uStack_1db0;
      auVar13._24_8_ = uStack_1da8;
      auVar5 = vpmuldq_avx2(auVar3,auVar13);
      auVar4 = vpsrlq_avx2(auVar3,ZEXT416(0x20));
      auVar14._8_8_ = uStack_1db8;
      auVar14._0_8_ = local_1dc0;
      auVar14._16_8_ = uStack_1db0;
      auVar14._24_8_ = uStack_1da8;
      auVar6 = vpsrlq_avx2(auVar14,ZEXT416(0x20));
      auVar4 = vpmuldq_avx2(auVar4,auVar6);
      auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x10));
      auVar1 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
      auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
      auVar1 = vpinsrd_avx(auVar1,0,3);
      auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
      auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
      auVar2 = vpinsrd_avx(auVar2,0,3);
      uStack_330 = auVar2._0_8_;
      uStack_328 = auVar2._8_8_;
      auVar8._16_8_ = uStack_330;
      auVar8._0_16_ = auVar1;
      auVar8._24_8_ = uStack_328;
      auVar5 = vpand_avx2(auVar5,auVar8);
      auVar4 = vpsrlq_avx2(auVar4,ZEXT416(0x10));
      auVar4 = vpsllq_avx2(auVar4,ZEXT416(0x20));
      auVar5 = vpor_avx2(auVar5,auVar4);
      auVar3 = vpaddd_avx2(auVar5,auVar3);
      auVar19._8_8_ = in_stack_ffffffffffffe288;
      auVar19._0_8_ = in_stack_ffffffffffffe280;
      auVar19._16_8_ = in_stack_ffffffffffffe290;
      auVar19._24_8_ = in_stack_ffffffffffffe298;
      auVar5 = vpmuldq_avx2(auVar3,auVar19);
      auVar3 = vpsrlq_avx2(auVar3,ZEXT416(0x20));
      auVar20._8_8_ = in_stack_ffffffffffffe288;
      auVar20._0_8_ = in_stack_ffffffffffffe280;
      auVar20._16_8_ = in_stack_ffffffffffffe290;
      auVar20._24_8_ = in_stack_ffffffffffffe298;
      auVar4 = vpsrlq_avx2(auVar20,ZEXT416(0x20));
      auVar4 = vpmuldq_avx2(auVar3,auVar4);
      auVar3 = vpsrlq_avx2(auVar5,ZEXT416(0xf));
      auVar1 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
      auVar1 = vpinsrd_avx(auVar1,0xffffffff,2);
      auVar1 = vpinsrd_avx(auVar1,0,3);
      auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0,1);
      auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
      auVar2 = vpinsrd_avx(auVar2,0,3);
      uStack_650 = auVar2._0_8_;
      uStack_648 = auVar2._8_8_;
      auVar7._16_8_ = uStack_650;
      auVar7._0_16_ = auVar1;
      auVar7._24_8_ = uStack_648;
      auVar3 = vpand_avx2(auVar3,auVar7);
      auVar5 = vpsrlq_avx2(auVar4,ZEXT416(0xf));
      auVar5 = vpsllq_avx2(auVar5,ZEXT416(0x20));
      auVar5 = vpor_avx2(auVar3,auVar5);
      auVar16._8_8_ = uStack_1d98;
      auVar16._0_8_ = local_1da0;
      auVar16._16_8_ = uStack_1d90;
      auVar16._24_8_ = in_stack_ffffffffffffe278;
      auVar3 = vpmulld_avx2(auVar5,auVar16);
      auVar4 = vpsrld_avx2(auVar3,ZEXT416(1));
      uStack_1ad8 = SUB328(ZEXT832(0),4);
      auVar3 = vpcmpgtd_avx2(auVar5,ZEXT832(uStack_1ad8) << 0x40);
      auVar5 = vpsignd_avx2(auVar5,*local_1d08);
      auVar4 = vpsignd_avx2(auVar4,*local_1d08);
      local_1c80 = auVar5._0_8_;
      uStack_1c78 = auVar5._8_8_;
      uStack_1c70 = auVar5._16_8_;
      uStack_1c68 = auVar5._24_8_;
      *in_stack_00000008 = local_1c80;
      in_stack_00000008[1] = uStack_1c78;
      in_stack_00000008[2] = uStack_1c70;
      in_stack_00000008[3] = uStack_1c68;
      local_1ca0 = auVar4._0_8_;
      uStack_1c98 = auVar4._8_8_;
      uStack_1c90 = auVar4._16_8_;
      uStack_1c88 = auVar4._24_8_;
      *(undefined8 *)qcoeff_ptr = local_1ca0;
      *(undefined8 *)(qcoeff_ptr + 2) = uStack_1c98;
      *(undefined8 *)(qcoeff_ptr + 4) = uStack_1c90;
      *(undefined8 *)(qcoeff_ptr + 6) = uStack_1c88;
      auVar3 = vpackssdw_avx2(auVar3,auVar3);
      auVar5 = vpermq_avx2(auVar3,0xd8);
      auVar3 = vpsubw_avx2(ZEXT1632(*(undefined1 (*) [16])scan),auVar5);
      auVar3 = vpand_avx2(auVar3,auVar5);
      auVar21 = vpmaxsw_avx2(auVar21,auVar3);
    }
    local_1d08 = local_1d08 + 1;
    in_stack_00000008 = in_stack_00000008 + 4;
    qcoeff_ptr = qcoeff_ptr + 8;
    scan = scan + 8;
  }
  auVar3 = vpshufd_avx2(auVar21,0xe);
  auVar21 = vpmaxsw_avx2(auVar21,auVar3);
  auVar3 = vpshuflw_avx2(auVar21,0xe);
  auVar21 = vpmaxsw_avx2(auVar21,auVar3);
  auVar3 = vpshuflw_avx2(auVar21,1);
  auVar21 = vpmaxsw_avx2(auVar21,auVar3);
  *dequant_ptr = auVar21._0_2_;
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const unsigned int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];
  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 1);

  quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 1);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize_logscale(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob, 1);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}